

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_list.c
# Opt level: O0

REF_STATUS ref_list_push(REF_LIST ref_list,REF_INT last)

{
  REF_INT *pRVar1;
  REF_INT last_local;
  REF_LIST ref_list_local;
  
  if (ref_list->max == ref_list->n) {
    ref_list->max = ref_list->max + 1000;
    fflush(_stdout);
    if (0 < ref_list->max) {
      pRVar1 = (REF_INT *)realloc(ref_list->value,(long)ref_list->max << 2);
      ref_list->value = pRVar1;
    }
    if (ref_list->value == (REF_INT *)0x0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_list.c",0x52,
             "ref_list_push","realloc ref_list->value NULL");
      printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",(ulong)(uint)ref_list->max,
             (long)ref_list->max,4,(long)ref_list->max << 2);
      return 2;
    }
  }
  ref_list->value[ref_list->n] = last;
  ref_list->n = ref_list->n + 1;
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_list_push(REF_LIST ref_list, REF_INT last) {
  if (ref_list_max(ref_list) == ref_list_n(ref_list)) {
    ref_list_max(ref_list) += 1000;
    ref_realloc(ref_list->value, ref_list_max(ref_list), REF_INT);
  }

  ref_list->value[ref_list_n(ref_list)] = last;

  ref_list_n(ref_list)++;

  return REF_SUCCESS;
}